

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O0

void Imath_2_5::extractEulerXYZ<float>(Matrix44<float> *mat,Vec3<float> *rot)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float e;
  float f;
  float g;
  float i_00;
  float *pfVar4;
  float *in_RSI;
  Matrix44<float> *in_RDI;
  double dVar5;
  float cy;
  Matrix44<float> N;
  Matrix44<float> M;
  Vec3<float> k;
  Vec3<float> j;
  Vec3<float> i;
  undefined4 in_stack_fffffffffffffe70;
  float j_00;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffe8c;
  Matrix44<float> local_100;
  Vec3<float> local_c0;
  Vec3<float> local_b4 [3];
  Vec3<float> *in_stack_ffffffffffffff78;
  Matrix44<float> *in_stack_ffffffffffffff80;
  Matrix44<float> local_74;
  Vec3<float> local_34;
  Vec3<float> local_28;
  Vec3<float> local_1c;
  float *local_10;
  Matrix44<float> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  pfVar4 = Matrix44<float>::operator[](in_RDI,0);
  fVar1 = *pfVar4;
  pfVar4 = Matrix44<float>::operator[](local_8,0);
  fVar2 = pfVar4[1];
  pfVar4 = Matrix44<float>::operator[](local_8,0);
  Vec3<float>::Vec3(&local_1c,fVar1,fVar2,pfVar4[2]);
  pfVar4 = Matrix44<float>::operator[](local_8,1);
  fVar1 = *pfVar4;
  pfVar4 = Matrix44<float>::operator[](local_8,1);
  fVar2 = pfVar4[1];
  pfVar4 = Matrix44<float>::operator[](local_8,1);
  Vec3<float>::Vec3(&local_28,fVar1,fVar2,pfVar4[2]);
  pfVar4 = Matrix44<float>::operator[](local_8,2);
  fVar1 = *pfVar4;
  pfVar4 = Matrix44<float>::operator[](local_8,2);
  fVar2 = pfVar4[1];
  pfVar4 = Matrix44<float>::operator[](local_8,2);
  Vec3<float>::Vec3(&local_34,fVar1,fVar2,pfVar4[2]);
  Vec3<float>::normalize
            ((Vec3<float> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  Vec3<float>::normalize
            ((Vec3<float> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  Vec3<float>::normalize
            ((Vec3<float> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  pfVar4 = Vec3<float>::operator[](&local_1c,0);
  fVar1 = *pfVar4;
  pfVar4 = Vec3<float>::operator[](&local_1c,1);
  fVar2 = *pfVar4;
  pfVar4 = Vec3<float>::operator[](&local_1c,2);
  fVar3 = *pfVar4;
  pfVar4 = Vec3<float>::operator[](&local_28,0);
  e = *pfVar4;
  pfVar4 = Vec3<float>::operator[](&local_28,1);
  f = *pfVar4;
  pfVar4 = Vec3<float>::operator[](&local_28,2);
  g = *pfVar4;
  pfVar4 = Vec3<float>::operator[](&local_34,0);
  i_00 = *pfVar4;
  pfVar4 = Vec3<float>::operator[](&local_34,1);
  j_00 = *pfVar4;
  pfVar4 = Vec3<float>::operator[](&local_34,2);
  uVar6 = 0;
  uVar7 = 0;
  Matrix44<float>::Matrix44
            (&local_74,fVar1,fVar2,fVar3,0.0,e,f,g,0.0,i_00,j_00,*pfVar4,0.0,0.0,0.0,0.0,1.0);
  pfVar4 = Matrix44<float>::operator[](&local_74,1);
  fVar1 = pfVar4[2];
  pfVar4 = Matrix44<float>::operator[](&local_74,2);
  dVar5 = Math<float>::atan2((double)(ulong)(uint)fVar1,(double)(ulong)(uint)pfVar4[2]);
  *local_10 = SUB84(dVar5,0);
  Matrix44<float>::Matrix44((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffe74,j_00));
  Vec3<float>::Vec3(&local_c0,-*local_10,0.0,0.0);
  Matrix44<float>::rotate<float>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  Matrix44<float>::operator*
            ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffe8c,uVar7),
             (Matrix44<float> *)CONCAT44(in_stack_fffffffffffffe84,uVar6));
  Matrix44<float>::operator=((Matrix44<float> *)local_b4,&local_100);
  pfVar4 = Matrix44<float>::operator[]((Matrix44<float> *)local_b4,0);
  fVar1 = *pfVar4;
  pfVar4 = Matrix44<float>::operator[]((Matrix44<float> *)local_b4,0);
  fVar2 = *pfVar4;
  pfVar4 = Matrix44<float>::operator[]((Matrix44<float> *)local_b4,0);
  fVar3 = pfVar4[1];
  pfVar4 = Matrix44<float>::operator[]((Matrix44<float> *)local_b4,0);
  dVar5 = Math<float>::sqrt((double)(ulong)(uint)(fVar1 * fVar2 + fVar3 * pfVar4[1]));
  pfVar4 = Matrix44<float>::operator[]((Matrix44<float> *)local_b4,0);
  dVar5 = Math<float>::atan2((double)(ulong)(uint)-pfVar4[2],(double)((ulong)dVar5 & 0xffffffff));
  local_10[1] = SUB84(dVar5,0);
  pfVar4 = Matrix44<float>::operator[]((Matrix44<float> *)local_b4,1);
  fVar1 = *pfVar4;
  pfVar4 = Matrix44<float>::operator[]((Matrix44<float> *)local_b4,1);
  dVar5 = Math<float>::atan2((double)(ulong)(uint)-fVar1,(double)(ulong)(uint)pfVar4[1]);
  local_10[2] = SUB84(dVar5,0);
  return;
}

Assistant:

void
extractEulerXYZ (const Matrix44<T> &mat, Vec3<T> &rot)
{
    //
    // Normalize the local x, y and z axes to remove scaling.
    //

    Vec3<T> i (mat[0][0], mat[0][1], mat[0][2]);
    Vec3<T> j (mat[1][0], mat[1][1], mat[1][2]);
    Vec3<T> k (mat[2][0], mat[2][1], mat[2][2]);

    i.normalize();
    j.normalize();
    k.normalize();

    Matrix44<T> M (i[0], i[1], i[2], 0, 
		   j[0], j[1], j[2], 0, 
		   k[0], k[1], k[2], 0, 
		   0,    0,    0,    1);

    //
    // Extract the first angle, rot.x.
    // 

    rot.x = Math<T>::atan2 (M[1][2], M[2][2]);

    //
    // Remove the rot.x rotation from M, so that the remaining
    // rotation, N, is only around two axes, and gimbal lock
    // cannot occur.
    //

    Matrix44<T> N;
    N.rotate (Vec3<T> (-rot.x, 0, 0));
    N = N * M;

    //
    // Extract the other two angles, rot.y and rot.z, from N.
    //

    T cy = Math<T>::sqrt (N[0][0]*N[0][0] + N[0][1]*N[0][1]);
    rot.y = Math<T>::atan2 (-N[0][2], cy);
    rot.z = Math<T>::atan2 (-N[1][0], N[1][1]);
}